

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::PixelBufferAccess::PixelBufferAccess
          (PixelBufferAccess *this,TextureFormat *format,int width,int height,int depth,void *data)

{
  TextureFormat format_00;
  int iVar1;
  
  format_00 = *format;
  (this->super_ConstPixelBufferAccess).m_format = format_00;
  (this->super_ConstPixelBufferAccess).m_size.m_data[0] = width;
  (this->super_ConstPixelBufferAccess).m_size.m_data[1] = height;
  (this->super_ConstPixelBufferAccess).m_size.m_data[2] = depth;
  iVar1 = getPixelSize(format_00);
  (this->super_ConstPixelBufferAccess).m_pitch.m_data[0] = iVar1;
  (this->super_ConstPixelBufferAccess).m_pitch.m_data[1] = width * iVar1;
  (this->super_ConstPixelBufferAccess).m_pitch.m_data[2] = height * width * iVar1;
  (this->super_ConstPixelBufferAccess).m_data = data;
  return;
}

Assistant:

PixelBufferAccess::PixelBufferAccess (const TextureFormat& format, int width, int height, int depth, void* data)
	: ConstPixelBufferAccess(format, width, height, depth, data)
{
}